

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::Assembler::_emitOpArray(Assembler *this,uint32_t instId,Operand_ *opArray,size_t opCount)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  Operand_ *op;
  Error local_64;
  
  switch(in_RCX) {
  case 0:
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDI + 0xb,in_RDI + 0xb,in_RDI + 0xb,in_RDI + 0xb);
    break;
  case 1:
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDX,in_RDI + 0xb,in_RDI + 0xb,in_RDI + 0xb);
    break;
  case 2:
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDI + 0xb,in_RDI + 0xb);
    break;
  case 3:
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDI + 0xb);
    break;
  case 4:
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30);
    break;
  case 5:
    in_RDI[0x14] = *(long *)(in_RDX + 0x40);
    in_RDI[0x15] = *(long *)(in_RDX + 0x48);
    in_RDI[0x16] = 0;
    in_RDI[0x17] = 0;
    *(uint *)((long)in_RDI + 0x3c) = *(uint *)((long)in_RDI + 0x3c) | 8;
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30);
    break;
  case 6:
    in_RDI[0x14] = *(long *)(in_RDX + 0x40);
    in_RDI[0x15] = *(long *)(in_RDX + 0x48);
    in_RDI[0x16] = *(long *)(in_RDX + 0x50);
    in_RDI[0x17] = *(long *)(in_RDX + 0x58);
    *(uint *)((long)in_RDI + 0x3c) = *(uint *)((long)in_RDI + 0x3c) | 8;
    local_64 = (**(code **)(*in_RDI + 0x20))
                         (in_RDI,in_ESI,in_RDX,in_RDX + 0x10,in_RDX + 0x20,in_RDX + 0x30);
    break;
  default:
    local_64 = 3;
  }
  return local_64;
}

Assistant:

Error Assembler::_emitOpArray(uint32_t instId, const Operand_* opArray, size_t opCount) {
  const Operand_* op = opArray;
  switch (opCount) {
    case 0: return _emit(instId, _none, _none, _none, _none);
    case 1: return _emit(instId, op[0], _none, _none, _none);
    case 2: return _emit(instId, op[0], op[1], _none, _none);
    case 3: return _emit(instId, op[0], op[1], op[2], _none);
    case 4: return _emit(instId, op[0], op[1], op[2], op[3]);

    case 5:
      _op4 = op[4];
      _op5.reset();
      _options |= kOptionOp4Op5Used;
      return _emit(instId, op[0], op[1], op[2], op[3]);

    case 6:
      _op4 = op[4];
      _op5 = op[5];
      _options |= kOptionOp4Op5Used;
      return _emit(instId, op[0], op[1], op[2], op[3]);

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }
}